

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_pool.c
# Opt level: O0

void ossl_rand_pool_free(RAND_POOL *pool)

{
  void *in_RDI;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  int line;
  
  if (in_RDI != (void *)0x0) {
    if (*(int *)((long)in_RDI + 0x10) == 0) {
      line = (int)((ulong)in_RDI >> 0x20);
      if (*(int *)((long)in_RDI + 0x14) == 0) {
        CRYPTO_clear_free(in_stack_00000010,in_stack_00000008,(char *)pool,line);
      }
      else {
        CRYPTO_secure_clear_free(in_stack_00000010,in_stack_00000008,(char *)pool,line);
      }
    }
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

void ossl_rand_pool_free(RAND_POOL *pool)
{
    if (pool == NULL)
        return;

    /*
     * Although it would be advisable from a cryptographical viewpoint,
     * we are not allowed to clear attached buffers, since they are passed
     * to ossl_rand_pool_attach() as `const unsigned char*`.
     * (see corresponding comment in ossl_rand_pool_attach()).
     */
    if (!pool->attached) {
        if (pool->secure)
            OPENSSL_secure_clear_free(pool->buffer, pool->alloc_len);
        else
            OPENSSL_clear_free(pool->buffer, pool->alloc_len);
    }

    OPENSSL_free(pool);
}